

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<std::__cxx11::string,char_const(&)[50],std::__cxx11::string&>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,
                   char (*b) [50],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  size_t local_50;
  char (*local_48) [50];
  undefined8 local_40;
  size_type local_38;
  pointer local_30;
  undefined8 local_28;
  
  local_68.first._M_str = (a->_M_dataplus)._M_p;
  local_68.first._M_len = a->_M_string_length;
  local_68.second = a;
  local_50 = strlen(*b);
  local_40 = 0;
  local_30 = (args->_M_dataplus)._M_p;
  local_38 = args->_M_string_length;
  local_28 = 0;
  views._M_len = 3;
  views._M_array = &local_68;
  local_48 = b;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}